

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4,bool relaxed)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  long *plVar8;
  runtime_error *this_00;
  uint uVar9;
  size_type *psVar10;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined1 local_7e;
  undefined1 local_7d [21];
  char local_68 [16];
  char *local_58 [2];
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression((CompilerGLSL *)__return_storage_ptr__,exp_str);
  bVar6 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (!bVar6) {
    lVar7 = ::std::__cxx11::string::rfind((char)exp_str,0x5b);
    if (lVar7 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (exp_str->_M_dataplus)._M_p;
      paVar1 = &exp_str->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar1) {
        uVar5 = *(undefined8 *)((long)&exp_str->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = exp_str->_M_string_length;
      (exp_str->_M_dataplus)._M_p = (pointer)paVar1;
      exp_str->_M_string_length = 0;
      (exp_str->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::substr((ulong)local_58,(ulong)exp_str);
    ::std::__cxx11::string::resize((ulong)exp_str,(char)lVar7);
    type_to_glsl_constructor_abi_cxx11_((string *)(local_7d + 5),this,exp_type);
    plVar8 = (long *)::std::__cxx11::string::append(local_7d + 5);
    local_38 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
    psVar10 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar10) {
      lVar7 = plVar8[3];
      local_38->_M_allocated_capacity = *psVar10;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((char *)local_7d._5_8_ != local_68) {
      operator_delete((void *)local_7d._5_8_);
    }
    local_7d._1_4_ = 0;
    if (exp_type->vecsize != 0) {
      do {
        local_7d[0] = 0x5b;
        local_7e = 0x5d;
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  ((string *)(local_7d + 5),(spirv_cross *)exp_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d,
                   local_7d + 1,(uint *)&local_7e,(char *)local_58,in_stack_ffffffffffffff78);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_7d._5_8_);
        if ((char *)local_7d._5_8_ != local_68) {
          operator_delete((void *)local_7d._5_8_);
        }
        if (local_7d._1_4_ + 1 < exp_type->vecsize) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        local_7d._1_4_ = local_7d._1_4_ + 1;
      } while ((uint)local_7d._1_4_ < exp_type->vecsize);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_58[0] == local_48) {
      return __return_storage_ptr__;
    }
    operator_delete(local_58[0]);
    return __return_storage_ptr__;
  }
  if (0x77 < (this->options).version) {
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x371432,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36641e,ts_2);
    return __return_storage_ptr__;
  }
  uVar2 = exp_type->vecsize;
  uVar3 = exp_type->columns;
  if (uVar3 == 2 && uVar2 == 2) {
    if ((!relaxed) || (lVar7 = 0x24b0, (this->options).es == false)) {
      lVar7 = 0x24ac;
    }
    uVar9 = *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar7 + -0x40);
    if ((uVar9 & 1) != 0) goto LAB_0021fdc0;
    uVar9 = uVar9 | 1;
  }
  else if (uVar3 == 3 && uVar2 == 3) {
    if ((!relaxed) || (lVar7 = 0x24b0, (this->options).es == false)) {
      lVar7 = 0x24ac;
    }
    uVar9 = *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar7 + -0x40);
    if ((uVar9 & 2) != 0) goto LAB_0021fdc0;
    uVar9 = uVar9 | 2;
  }
  else {
    if ((uVar2 != 4) || (uVar3 != 4)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_58[0] = local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,
                 "Non-square matrices are not supported in legacy GLSL, cannot transpose.","");
      ::std::runtime_error::runtime_error(this_00,(string *)local_58);
      *(undefined ***)this_00 = &PTR__runtime_error_003fce08;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((!relaxed) || (lVar7 = 0x24b0, (this->options).es == false)) {
      lVar7 = 0x24ac;
    }
    uVar9 = *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar7 + -0x40);
    if ((uVar9 & 4) != 0) goto LAB_0021fdc0;
    uVar9 = uVar9 | 4;
  }
  *(uint *)((this->super_Compiler).ir.ids.stack_storage.aligned_char + lVar7 + -0x40) = uVar9;
  Compiler::force_recompile(&this->super_Compiler);
LAB_0021fdc0:
  local_58[0] = "MP";
  if (!relaxed) {
    local_58[0] = "";
  }
  if ((this->options).es == false) {
    local_58[0] = "";
  }
  join<char_const(&)[13],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)0x3610f7,(char (*) [13])local_58,
             (char **)0x37dfb0,(char (*) [2])exp_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36641e,
             (char (*) [2])in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/, bool relaxed)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
			require_polyfill(PolyfillTranspose2x2, relaxed);
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
			require_polyfill(PolyfillTranspose3x3, relaxed);
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
			require_polyfill(PolyfillTranspose4x4, relaxed);
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose", (options.es && relaxed) ? "MP" : "", "(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}